

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::MidiEventQueue::MidiEventQueue
          (MidiEventQueue *this,Bit32u useRingBufferSize,Bit32u storageBufferSize)

{
  SysexDataStorage *pSVar1;
  ulong uVar2;
  MidiEvent *pMVar3;
  uint local_1c;
  Bit32u i;
  Bit32u storageBufferSize_local;
  Bit32u useRingBufferSize_local;
  MidiEventQueue *this_local;
  
  pSVar1 = SysexDataStorage::create(storageBufferSize);
  this->sysexDataStorage = pSVar1;
  uVar2 = SUB168(ZEXT416(useRingBufferSize) * ZEXT816(0x10),0);
  if (SUB168(ZEXT416(useRingBufferSize) * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pMVar3 = (MidiEvent *)operator_new__(uVar2);
  this->ringBuffer = pMVar3;
  this->ringBufferMask = useRingBufferSize - 1;
  for (local_1c = 0; local_1c <= this->ringBufferMask; local_1c = local_1c + 1) {
    this->ringBuffer[local_1c].sysexData = (Bit8u *)0x0;
  }
  reset(this);
  return;
}

Assistant:

MidiEventQueue::MidiEventQueue(Bit32u useRingBufferSize, Bit32u storageBufferSize) :
	sysexDataStorage(*SysexDataStorage::create(storageBufferSize)),
	ringBuffer(new MidiEvent[useRingBufferSize]), ringBufferMask(useRingBufferSize - 1)
{
	for (Bit32u i = 0; i <= ringBufferMask; i++) {
		ringBuffer[i].sysexData = NULL;
	}
	reset();
}